

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# web_connection_base.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::web_connection_base::add_headers
          (web_connection_base *this,string *request,session_settings *sett,bool using_proxy)

{
  pointer ppVar1;
  bool bVar2;
  int iVar3;
  string *psVar4;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *h;
  pointer ppVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  ::std::__cxx11::string::append((char *)request);
  ::std::__cxx11::string::append((string *)request);
  if ((((this->super_peer_connection).field_0x888 != '\0') ||
      (bVar2 = session_settings::get_bool
                         ((this->super_peer_connection).super_peer_connection_hot_members.m_settings
                          ,0x802d), bVar2)) &&
     (bVar2 = session_settings::get_bool
                        ((this->super_peer_connection).super_peer_connection_hot_members.m_settings,
                         0x8026), !bVar2)) {
    ::std::__cxx11::string::append((char *)request);
    session_settings::get_str_abi_cxx11_
              ((this->super_peer_connection).super_peer_connection_hot_members.m_settings,0);
    ::std::__cxx11::string::append((string *)request);
  }
  if (((this->m_external_auth)._M_string_length != 0) ||
     ((this->m_basic_auth)._M_string_length != 0)) {
    ::std::__cxx11::string::append((char *)request);
    ::std::__cxx11::string::append((string *)request);
  }
  iVar3 = session_settings::get_int(sett,0x407b);
  if (iVar3 == 5) {
    ::std::__cxx11::string::append((char *)request);
    psVar4 = session_settings::get_str_abi_cxx11_(sett,7);
    ::std::operator+(&local_90,psVar4,":");
    psVar4 = session_settings::get_str_abi_cxx11_(sett,8);
    ::std::operator+(&local_70,&local_90,psVar4);
    base64encode(&local_50,&local_70);
    ::std::__cxx11::string::append((string *)request);
    ::std::__cxx11::string::~string((string *)&local_50);
    ::std::__cxx11::string::~string((string *)&local_70);
    ::std::__cxx11::string::~string((string *)&local_90);
  }
  ppVar1 = (this->m_extra_headers).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar5 = (this->m_extra_headers).
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; ppVar5 != ppVar1; ppVar5 = ppVar5 + 1) {
    ::std::__cxx11::string::append((char *)request);
    ::std::__cxx11::string::append((string *)request);
    ::std::__cxx11::string::append((char *)request);
    ::std::__cxx11::string::append((string *)request);
  }
  if (using_proxy) {
    ::std::__cxx11::string::append((char *)request);
  }
  else if ((this->super_peer_connection).field_0x888 != '\x01') {
    return;
  }
  ::std::__cxx11::string::append((char *)request);
  return;
}

Assistant:

void web_connection_base::add_headers(std::string& request
		, aux::session_settings const& sett, bool const using_proxy) const
	{
		request += "Host: ";
		request += m_host;
		if ((m_first_request || m_settings.get_bool(settings_pack::always_send_user_agent))
			&& !m_settings.get_bool(settings_pack::anonymous_mode))
		{
			request += "\r\nUser-Agent: ";
			request += m_settings.get_str(settings_pack::user_agent);
		}
		if (!m_external_auth.empty())
		{
			request += "\r\nAuthorization: ";
			request += m_external_auth;
		}
		else if (!m_basic_auth.empty())
		{
			request += "\r\nAuthorization: Basic ";
			request += m_basic_auth;
		}
		if (sett.get_int(settings_pack::proxy_type) == settings_pack::http_pw)
		{
			request += "\r\nProxy-Authorization: Basic ";
			request += base64encode(sett.get_str(settings_pack::proxy_username)
				+ ":" + sett.get_str(settings_pack::proxy_password));
		}
		for (auto const& h : m_extra_headers)
		{
			request += "\r\n";
			request += h.first;
			request += ": ";
			request += h.second;
		}
		if (using_proxy) {
			request += "\r\nProxy-Connection: keep-alive";
		}
		if (m_first_request || using_proxy) {
			request += "\r\nConnection: keep-alive";
		}
	}